

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void fs_emit_error(void)

{
  int iVar1;
  undefined4 uVar2;
  int *piVar3;
  long *plVar4;
  ostream *poVar5;
  long *extraout_RDX;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  if (iVar1 != 0) {
    plVar4 = (long *)std::_V2::generic_category();
    uVar2 = (**(code **)(*plVar4 + 0x28))(plVar4,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"errno:",6);
    (**(code **)(*extraout_RDX + 0x20))(&local_40,extraout_RDX,uVar2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_40,local_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  return;
}

Assistant:

static void fs_emit_error()
{
#if defined(_WIN32) || defined(__CYGWIN__)
  if (DWORD error = GetLastError(); error)
    std::cerr << "GetLastError:" << std::system_category().message(error) << " ";
#else
  if(errno){
    auto econd = std::generic_category().default_error_condition(errno);
    std::cerr << "errno:" << econd.message() << " ";
  }
#endif
}